

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O3

ValuedAction __thiscall despot::DPOMCP::Search(DPOMCP *this,double timeout)

{
  Belief *pBVar1;
  DSPOMDP *pDVar2;
  int iVar3;
  int iVar4;
  clock_t cVar5;
  VNode *pVVar6;
  log_ostream *plVar7;
  clock_t cVar8;
  ostream *poVar9;
  long *plVar10;
  QNode *pQVar11;
  ACT_TYPE action;
  ulong uVar12;
  double dVar13;
  ValuedAction VVar14;
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  RandomStreams streams;
  timeval tv_1;
  vector<despot::State_*,_std::allocator<despot::State_*>_> local_80;
  double local_68;
  RandomStreams local_60;
  timeval local_40;
  
  cVar5 = clock();
  gettimeofday((timeval *)&local_60,(__timezone_ptr_t)0x0);
  local_68 = (double)(long)local_60.streams_.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
  pBVar1 = (this->super_POMCP).super_Solver.belief_;
  (*pBVar1->_vptr_Belief[2])(&local_80,pBVar1,(ulong)(uint)DAT_00192dbc);
  RandomStreams::RandomStreams(&local_60,DAT_00192dbc,DAT_00192dc0);
  pVVar6 = ConstructTree(&local_80,&local_60,(this->super_POMCP).super_Solver.model_,
                         (this->super_POMCP).prior_,&(this->super_POMCP).super_Solver.history_,
                         timeout);
  (this->super_POMCP).root_ = pVVar6;
  if (local_80.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_80.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar12 = 0;
    do {
      pDVar2 = (this->super_POMCP).super_Solver.model_;
      (*pDVar2->_vptr_DSPOMDP[0x17])
                (pDVar2,local_80.
                        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar12]);
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)local_80.
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_80.
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  iVar3 = logging::level();
  if (0 < iVar3) {
    iVar3 = logging::level();
    if (2 < iVar3) {
      plVar7 = logging::stream(3);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar7->super_ostream,"[DPOMCP::Search] Time: CPU / Real = ",0x24);
      cVar8 = clock();
      poVar9 = std::ostream::_M_insert<double>(((double)cVar8 - (double)cVar5) / 1000000.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," / ",3);
      dVar13 = (double)(long)local_60.streams_.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish / 1000000.0 + local_68;
      gettimeofday(&local_40,(__timezone_ptr_t)0x0);
      poVar9 = std::ostream::_M_insert<double>
                         (((double)local_40.tv_usec / 1000000.0 + (double)local_40.tv_sec) - dVar13)
      ;
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      poVar9 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Tree size = ",0xc);
      iVar3 = VNode::Size((this->super_POMCP).root_);
      plVar10 = (long *)std::ostream::operator<<(poVar9,iVar3);
      std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
      std::ostream::put((char)plVar10);
      std::ostream::flush();
    }
  }
  VVar14 = POMCP::OptimalAction((this->super_POMCP).root_);
  if (VVar14.action == 0xffffffff) {
    iVar3 = 0;
    while( true ) {
      iVar4 = (*((this->super_POMCP).super_Solver.model_)->_vptr_DSPOMDP[5])();
      if (iVar4 <= iVar3) break;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"action ",7);
      poVar9 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
      pQVar11 = VNode::Child((this->super_POMCP).root_,iVar3);
      iVar4 = QNode::count(pQVar11);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
      pQVar11 = VNode::Child((this->super_POMCP).root_,iVar3);
      dVar13 = QNode::value(pQVar11);
      poVar9 = std::ostream::_M_insert<double>(dVar13);
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      iVar3 = iVar3 + 1;
    }
  }
  pVVar6 = (this->super_POMCP).root_;
  if (pVVar6 != (VNode *)0x0) {
    VNode::~VNode(pVVar6);
  }
  operator_delete(pVVar6,0x98);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_60.streams_);
  if (local_80.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.
                          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  VVar14._4_4_ = 0;
  return VVar14;
}

Assistant:

ValuedAction DPOMCP::Search(double timeout) {
	double start_cpu = clock(), start_real = get_time_second();

	vector<State*> particles = belief_->Sample(Globals::config.num_scenarios);

	RandomStreams streams(Globals::config.num_scenarios,
		Globals::config.search_depth);

	root_ = ConstructTree(particles, streams, model_, prior_, history_,
		timeout);

	for (int i = 0; i < particles.size(); i++)
		model_->Free(particles[i]);

	logi << "[DPOMCP::Search] Time: CPU / Real = "
		<< ((clock() - start_cpu) / CLOCKS_PER_SEC) << " / "
		<< (get_time_second() - start_real) << endl << "Tree size = "
		<< root_->Size() << endl;

	ValuedAction astar = OptimalAction(root_);
	if (astar.action == -1) {
		for (ACT_TYPE action = 0; action < model_->NumActions(); action++) {
			cout << "action " << action << ": " << root_->Child(action)->count()
				<< " " << root_->Child(action)->value() << endl;
		}
	}

	delete root_;
	return astar;
}